

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::readObject(QPDF *this,string *description,QPDFObjGen og)

{
  StringDecrypter *decrypter_00;
  bool bVar1;
  pointer pMVar2;
  element_type *peVar3;
  int extraout_var;
  element_type *peVar4;
  pointer pMVar5;
  pointer pMVar6;
  element_type *this_00;
  qpdf_offset_t offset_00;
  QPDFObjGen in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar7;
  bool local_36a;
  StringDecrypter *local_330;
  allocator<char> local_309;
  string local_308;
  QPDFExc local_2e8;
  allocator<char> local_261;
  string local_260;
  Token local_240;
  byte local_1cb;
  byte local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  undefined1 local_1a8 [8];
  Token token;
  string local_138;
  QPDFExc local_118;
  type_conflict2 *local_98;
  type_conflict2 *empty;
  type *object;
  pair<QPDFObjectHandle,_bool> local_78;
  StringDecrypter *local_60;
  StringDecrypter *decrypter_ptr;
  undefined1 local_50 [8];
  StringDecrypter decrypter;
  qpdf_offset_t offset;
  string *description_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  setLastObjectDescription((QPDF *)description,(string *)og,in_RCX);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)description)
  ;
  peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar2->file);
  decrypter.og.obj = (*peVar3->_vptr_InputSource[4])();
  decrypter.og.gen = extraout_var;
  StringDecrypter::StringDecrypter((StringDecrypter *)local_50,(QPDF *)description,in_RCX);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)description)
  ;
  peVar4 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar2->encp);
  if ((peVar4->encrypted & 1U) == 0) {
    local_330 = (StringDecrypter *)0x0;
  }
  else {
    local_330 = (StringDecrypter *)local_50;
  }
  local_60 = local_330;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)description)
  ;
  peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &pMVar2->file);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)description)
  ;
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)description)
  ;
  decrypter_00 = local_60;
  pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)description)
  ;
  QPDFParser::parse(&local_78,peVar3,&pMVar2->last_object_description,&pMVar5->tokenizer,
                    decrypter_00,(QPDF *)description,(bool)(pMVar6->in_xref_reconstruction & 1));
  empty = (type_conflict2 *)std::get<0ul,QPDFObjectHandle,bool>(&local_78);
  local_98 = std::get<1ul,QPDFObjectHandle,bool>(&local_78);
  if ((*local_98 & 1U) == 0) {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                        description);
    peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar2->file);
    readToken((Token *)local_1a8,(QPDF *)description,peVar3,0);
    local_1ca = 0;
    local_1cb = 0;
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)empty);
    local_36a = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_1ca = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"stream",&local_1c9);
      local_1cb = 1;
      local_36a = QPDFTokenizer::Token::isWord((Token *)local_1a8,&local_1c8);
    }
    if ((local_1cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    if ((local_1ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_1c9);
    }
    if (local_36a != false) {
      readStream((QPDF *)description,(QPDFObjectHandle *)empty,in_RCX,(qpdf_offset_t)decrypter.og);
      pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                          description);
      peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar2->file);
      readToken(&local_240,(QPDF *)description,peVar3,0);
      QPDFTokenizer::Token::operator=((Token *)local_1a8,&local_240);
      QPDFTokenizer::Token::~Token(&local_240);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"endobj",&local_261);
    bVar1 = QPDFTokenizer::Token::isWord((Token *)local_1a8,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QTC::TC("qpdf","QPDF err expected endobj",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"expected endobj",&local_309);
      damagedPDF(&local_2e8,(QPDF *)description,&local_308);
      warn((QPDF *)description,&local_2e8);
      QPDFExc::~QPDFExc(&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
    }
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)empty);
    token.error_message.field_2._8_4_ = 1;
    QPDFTokenizer::Token::~Token((Token *)local_1a8);
  }
  else {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                        description);
    peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar2->file);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                        description);
    this_00 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar2->file);
    offset_00 = InputSource::getLastOffset(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"empty object treated as null",
               (allocator<char> *)(token.error_message.field_2._M_local_buf + 0xf));
    damagedPDF(&local_118,(QPDF *)description,peVar3,offset_00,&local_138);
    warn((QPDF *)description,&local_118);
    QPDFExc::~QPDFExc(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator
              ((allocator<char> *)(token.error_message.field_2._M_local_buf + 0xf));
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)empty);
    token.error_message.field_2._8_4_ = 1;
  }
  std::pair<QPDFObjectHandle,_bool>::~pair(&local_78);
  StringDecrypter::~StringDecrypter((StringDecrypter *)local_50);
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObject(std::string const& description, QPDFObjGen og)
{
    setLastObjectDescription(description, og);
    qpdf_offset_t offset = m->file->tell();

    StringDecrypter decrypter{this, og};
    StringDecrypter* decrypter_ptr = m->encp->encrypted ? &decrypter : nullptr;
    auto [object, empty] = QPDFParser::parse(
        *m->file,
        m->last_object_description,
        m->tokenizer,
        decrypter_ptr,
        *this,
        m->in_xref_reconstruction);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(damagedPDF(*m->file, m->file->getLastOffset(), "empty object treated as null"));
        return object;
    }
    auto token = readToken(*m->file);
    if (object.isDictionary() && token.isWord("stream")) {
        readStream(object, og, offset);
        token = readToken(*m->file);
    }
    if (!token.isWord("endobj")) {
        QTC::TC("qpdf", "QPDF err expected endobj");
        warn(damagedPDF("expected endobj"));
    }
    return object;
}